

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O2

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,SystemSockAddrIn *s)

{
  undefined8 uVar1;
  pointer_type psVar2;
  
  (this->sa).super_type.m_initialized = false;
  uVar1 = *(undefined8 *)s->sin_zero;
  *(undefined8 *)&(this->sa).super_type.m_storage.dummy_ = *(undefined8 *)s;
  *(undefined8 *)((long)&(this->sa).super_type.m_storage.dummy_ + 8) = uVar1;
  (this->sa).super_type.m_initialized = true;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  inet_ntoa((in_addr)(psVar2->sin_addr).s_addr);
  std::__cxx11::string::assign((char *)&this->host);
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  this->port = (uint)(ushort)(psVar2->sin_port << 8 | psVar2->sin_port >> 8);
  return;
}

Assistant:

Inet_addr::Impl::Impl( const SystemSockAddrIn& s ):
  sa(s)
{
  host = inet_ntoa( sa->sin_addr );
  port = ntohs( sa->sin_port );
}